

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_2::TestGroup::TestGroup(TestGroup *this,shared_ptr<Catch::Config> *config)

{
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vectorStrings *this_00;
  reference pFVar5;
  const_iterator __first;
  const_iterator __last;
  FilterMatch *match;
  iterator __end3_1;
  iterator __begin3_1;
  Matches *__range3_1;
  reference local_90;
  reference local_88;
  TestCase *test;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range3;
  vectorStrings *invalidArgs;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_48;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *allTestCases;
  IStreamingReporterPtr local_30;
  IConfigPtr local_28;
  shared_ptr<Catch::Config> *local_18;
  shared_ptr<Catch::Config> *config_local;
  TestGroup *this_local;
  
  local_18 = config;
  config_local = &this->m_config;
  clara::std::shared_ptr<Catch::Config>::shared_ptr(&this->m_config,config);
  std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
            ((shared_ptr<Catch::IConfig_const> *)&local_28,local_18);
  makeReporter((anon_unknown_2 *)&local_30,local_18);
  RunContext::RunContext(&this->m_context,&local_28,&local_30);
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::~unique_ptr(&local_30);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr(&local_28);
  clara::std::
  set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::set(&this->m_tests);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  vector(&this->m_matches);
  peVar4 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  local_48 = getAllTestCasesSorted(&peVar4->super_IConfig);
  peVar4 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar3 = (*(peVar4->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  pvVar1 = local_48;
  peVar4 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  TestSpec::matchesByFilter
            ((Matches *)&invalidArgs,(TestSpec *)CONCAT44(extraout_var,iVar3),pvVar1,
             &peVar4->super_IConfig);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  operator=(&this->m_matches,
            (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
            &invalidArgs);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          &invalidArgs);
  peVar4 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  iVar3 = (*(peVar4->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  this_00 = TestSpec::getInvalidArgs_abi_cxx11_((TestSpec *)CONCAT44(extraout_var_00,iVar3));
  bVar2 = clara::std::
          vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::empty
                    (&this->m_matches);
  if ((bVar2) &&
     (bVar2 = clara::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(this_00), pvVar1 = local_48, bVar2)) {
    __end3 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(local_48);
    test = (TestCase *)
           clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(pvVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                       *)&test), bVar2) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator*(&__end3);
      bVar2 = TestCaseInfo::isHidden(&local_88->super_TestCaseInfo);
      if (!bVar2) {
        local_90 = local_88;
        std::
        set<Catch::TestCase_const*,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
        ::emplace<Catch::TestCase_const*>
                  ((set<Catch::TestCase_const*,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                    *)&this->m_tests,&local_90);
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator++(&__end3);
    }
  }
  else {
    __end3_1 = clara::std::
               vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
               begin(&this->m_matches);
    match = (FilterMatch *)
            clara::std::
            vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::end
                      (&this->m_matches);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                               *)&match), bVar2) {
      pFVar5 = __gnu_cxx::
               __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
               ::operator*(&__end3_1);
      __first = clara::std::
                vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::begin
                          (&pFVar5->tests);
      __last = clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
               ::end(&pFVar5->tests);
      std::
      set<Catch::TestCase_const*,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
      ::
      insert<__gnu_cxx::__normal_iterator<Catch::TestCase_const*const*,std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>>>
                ((set<Catch::TestCase_const*,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                  *)&this->m_tests,
                 (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                  )__last._M_current);
      __gnu_cxx::
      __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
      ::operator++(&__end3_1);
    }
  }
  return;
}

Assistant:

explicit TestGroup(std::shared_ptr<Config> const& config)
            : m_config{config}
            , m_context{config, makeReporter(config)}
            {
                auto const& allTestCases = getAllTestCasesSorted(*m_config);
                m_matches = m_config->testSpec().matchesByFilter(allTestCases, *m_config);
                auto const& invalidArgs = m_config->testSpec().getInvalidArgs();

                if (m_matches.empty() && invalidArgs.empty()) {
                    for (auto const& test : allTestCases)
                        if (!test.isHidden())
                            m_tests.emplace(&test);
                } else {
                    for (auto const& match : m_matches)
                        m_tests.insert(match.tests.begin(), match.tests.end());
                }
            }